

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O2

bool Assimp::Blender::read<Assimp::Blender::MLoop>
               (Structure *s,MLoop *p,size_t cnt,FileDatabase *db)

{
  int *piVar1;
  bool bVar2;
  MLoop read;
  MLoop local_48;
  
  piVar1 = &p->v;
  while (bVar2 = cnt != 0, cnt = cnt - 1, bVar2) {
    local_48.super_ElemBase.dna_type = (char *)0x0;
    local_48.super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_0080ecf0;
    Structure::Convert<Assimp::Blender::MLoop>(s,&local_48,db);
    *(char **)(piVar1 + -2) = local_48.super_ElemBase.dna_type;
    *(undefined8 *)piVar1 = local_48._16_8_;
    piVar1 = piVar1 + 6;
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }